

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_257,_true,_embree::avx2::VirtualCurveIntersectorK<8>,_true>::
     occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  byte bVar1;
  BVH *bvh;
  size_t sVar2;
  ulong uVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  ulong uVar23;
  char cVar24;
  bool bVar25;
  int iVar26;
  ulong uVar27;
  uint uVar28;
  undefined4 uVar29;
  ulong uVar30;
  ulong extraout_RDX;
  ulong *puVar31;
  long lVar32;
  NodeRef root;
  undefined1 (*pauVar33) [32];
  uint uVar34;
  float fVar35;
  float fVar43;
  float fVar44;
  float fVar45;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  float fVar46;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 in_ZMM1 [64];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar65 [32];
  undefined1 auVar64 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [64];
  undefined1 auVar78 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  vfloat4 a0;
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [64];
  undefined1 auVar89 [16];
  undefined1 auVar90 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [64];
  vbool<8> terminated;
  TravRayK<8,_true> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  undefined4 local_2a00 [8];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_29e0;
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [8];
  float fStack_2938;
  float fStack_2934;
  float fStack_2930;
  float fStack_292c;
  float fStack_2928;
  undefined1 local_2920 [8];
  float fStack_2918;
  float fStack_2914;
  float fStack_2910;
  float fStack_290c;
  float fStack_2908;
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined4 local_2800;
  undefined4 uStack_27fc;
  undefined4 uStack_27f8;
  undefined4 uStack_27f4;
  undefined4 uStack_27f0;
  undefined4 uStack_27ec;
  undefined4 uStack_27e8;
  undefined4 uStack_27e4;
  undefined1 local_27e0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_27c0;
  undefined1 local_27a0 [16];
  undefined1 auStack_2790 [16];
  undefined1 auStack_2780 [368];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar74 [32];
  undefined1 auVar79 [32];
  
  bvh = (BVH *)This->ptr;
  sVar2 = (bvh->root).ptr;
  if (sVar2 != 8) {
    auVar53 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar57 = *(undefined1 (*) [32])(ray + 0x100);
    auVar47 = vpcmpeqd_avx2(auVar53,(undefined1  [32])valid_i->field_0);
    auVar53 = vcmpps_avx(auVar57,ZEXT1632(ZEXT816(0) << 0x40),5);
    auVar53 = vandps_avx(auVar53,auVar47);
    uVar28 = vmovmskps_avx(auVar53);
    if (uVar28 != 0) {
      auVar5 = vpackssdw_avx(auVar53._0_16_,auVar53._16_16_);
      local_2980 = *(undefined1 (*) [32])(ray + 0x80);
      local_2960 = *(undefined1 (*) [32])(ray + 0xa0);
      _local_2940 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar66._0_4_ = local_2940._0_4_ * local_2940._0_4_;
      auVar66._4_4_ = local_2940._4_4_ * local_2940._4_4_;
      auVar66._8_4_ = local_2940._8_4_ * local_2940._8_4_;
      auVar66._12_4_ = local_2940._12_4_ * local_2940._12_4_;
      auVar66._16_4_ = local_2940._16_4_ * local_2940._16_4_;
      auVar66._20_4_ = local_2940._20_4_ * local_2940._20_4_;
      auVar66._28_36_ = in_ZMM5._28_36_;
      auVar66._24_4_ = local_2940._24_4_ * local_2940._24_4_;
      auVar67 = vfmadd231ps_fma(auVar66._0_32_,local_2960,local_2960);
      auVar67 = vfmadd231ps_fma(ZEXT1632(auVar67),local_2980,local_2980);
      auVar53 = vrsqrtps_avx(ZEXT1632(auVar67));
      uVar30 = (ulong)(uVar28 & 0xff);
      fVar35 = auVar53._0_4_;
      fVar43 = auVar53._4_4_;
      fVar44 = auVar53._8_4_;
      fVar45 = auVar53._12_4_;
      fVar46 = auVar53._16_4_;
      fVar50 = auVar53._20_4_;
      fVar51 = auVar53._24_4_;
      auVar47._4_4_ = fVar43 * fVar43 * fVar43 * auVar67._4_4_ * -0.5;
      auVar47._0_4_ = fVar35 * fVar35 * fVar35 * auVar67._0_4_ * -0.5;
      auVar47._8_4_ = fVar44 * fVar44 * fVar44 * auVar67._8_4_ * -0.5;
      auVar47._12_4_ = fVar45 * fVar45 * fVar45 * auVar67._12_4_ * -0.5;
      auVar47._16_4_ = fVar46 * fVar46 * fVar46 * -0.0;
      auVar47._20_4_ = fVar50 * fVar50 * fVar50 * -0.0;
      auVar47._24_4_ = fVar51 * fVar51 * fVar51 * -0.0;
      auVar47._28_4_ = 0;
      auVar60._8_4_ = 0x3fc00000;
      auVar60._0_8_ = 0x3fc000003fc00000;
      auVar60._12_4_ = 0x3fc00000;
      auVar60._16_4_ = 0x3fc00000;
      auVar60._20_4_ = 0x3fc00000;
      auVar60._24_4_ = 0x3fc00000;
      auVar60._28_4_ = 0x3fc00000;
      auVar67 = vfmadd213ps_fma(auVar60,auVar53,auVar47);
      local_27c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)ZEXT1632(auVar67);
      auVar64._8_4_ = 0x80000000;
      auVar64._0_8_ = 0x8000000080000000;
      auVar64._12_4_ = 0x80000000;
      auVar67._12_4_ = 0;
      auVar67._0_12_ = ZEXT812(0);
      auVar67 = auVar67 << 0x20;
      while (uVar30 != 0) {
        lVar32 = 0;
        for (uVar27 = uVar30; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
          lVar32 = lVar32 + 1;
        }
        uVar27 = (ulong)(uint)((int)lVar32 * 4);
        auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar27 + 0x80)),
                                ZEXT416(*(uint *)(ray + uVar27 + 0xa0)),0x1c);
        auVar78 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + uVar27 + 0xc0)),0x28);
        fVar35 = *(float *)((long)&local_27c0 + uVar27);
        auVar82._0_4_ = auVar78._0_4_ * fVar35;
        auVar82._4_4_ = auVar78._4_4_ * fVar35;
        auVar82._8_4_ = auVar78._8_4_ * fVar35;
        auVar82._12_4_ = auVar78._12_4_ * fVar35;
        auVar89 = vshufpd_avx(auVar82,auVar82,1);
        auVar78 = vmovshdup_avx(auVar82);
        auVar85 = vunpckhps_avx(auVar82,auVar67);
        auVar86 = vshufps_avx(auVar85,ZEXT416(auVar78._0_4_ ^ 0x80000000),0x41);
        auVar85._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
        auVar85._8_8_ = auVar89._8_8_ ^ auVar64._8_8_;
        auVar85 = vinsertps_avx(auVar85,auVar82,0x2a);
        auVar78 = vdpps_avx(auVar86,auVar86,0x7f);
        auVar89 = vdpps_avx(auVar85,auVar85,0x7f);
        auVar78 = vcmpps_avx(auVar89,auVar78,1);
        auVar91._0_4_ = auVar78._0_4_;
        auVar91._4_4_ = auVar91._0_4_;
        auVar91._8_4_ = auVar91._0_4_;
        auVar91._12_4_ = auVar91._0_4_;
        auVar78 = vblendvps_avx(auVar85,auVar86,auVar91);
        auVar89 = vdpps_avx(auVar78,auVar78,0x7f);
        auVar85 = vrsqrtss_avx(auVar89,auVar89);
        fVar43 = auVar85._0_4_;
        fVar43 = fVar43 * 1.5 - auVar89._0_4_ * 0.5 * fVar43 * fVar43 * fVar43;
        auVar86._0_4_ = auVar78._0_4_ * fVar43;
        auVar86._4_4_ = auVar78._4_4_ * fVar43;
        auVar86._8_4_ = auVar78._8_4_ * fVar43;
        auVar86._12_4_ = auVar78._12_4_ * fVar43;
        auVar78 = vshufps_avx(auVar86,auVar86,0xc9);
        auVar89 = vshufps_avx(auVar82,auVar82,0xc9);
        auVar92._0_4_ = auVar86._0_4_ * auVar89._0_4_;
        auVar92._4_4_ = auVar86._4_4_ * auVar89._4_4_;
        auVar92._8_4_ = auVar86._8_4_ * auVar89._8_4_;
        auVar92._12_4_ = auVar86._12_4_ * auVar89._12_4_;
        auVar78 = vfmsub231ps_fma(auVar92,auVar82,auVar78);
        auVar85 = vshufps_avx(auVar78,auVar78,0xc9);
        auVar78 = vdpps_avx(auVar85,auVar85,0x7f);
        uVar30 = uVar30 - 1 & uVar30;
        auVar89 = vrsqrtss_avx(auVar78,auVar78);
        fVar43 = auVar89._0_4_;
        fVar43 = fVar43 * 1.5 - auVar78._0_4_ * 0.5 * fVar43 * fVar43 * fVar43;
        auVar89._0_4_ = fVar43 * auVar85._0_4_;
        auVar89._4_4_ = fVar43 * auVar85._4_4_;
        auVar89._8_4_ = fVar43 * auVar85._8_4_;
        auVar89._12_4_ = fVar43 * auVar85._12_4_;
        auVar78._0_4_ = fVar35 * auVar82._0_4_;
        auVar78._4_4_ = fVar35 * auVar82._4_4_;
        auVar78._8_4_ = fVar35 * auVar82._8_4_;
        auVar78._12_4_ = fVar35 * auVar82._12_4_;
        auVar85 = vunpcklps_avx(auVar86,auVar78);
        auVar78 = vunpckhps_avx(auVar86,auVar78);
        auVar86 = vunpcklps_avx(auVar89,auVar67);
        auVar89 = vunpckhps_avx(auVar89,auVar67);
        auVar89 = vunpcklps_avx(auVar78,auVar89);
        auVar82 = vunpcklps_avx(auVar85,auVar86);
        auVar78 = vunpckhps_avx(auVar85,auVar86);
        lVar32 = lVar32 * 0x30;
        *(undefined1 (*) [16])(local_27a0 + lVar32) = auVar82;
        *(undefined1 (*) [16])(auStack_2790 + lVar32) = auVar78;
        *(undefined1 (*) [16])(auStack_2780 + lVar32) = auVar89;
      }
      local_29e0._0_8_ = *(undefined8 *)ray;
      local_29e0._8_8_ = *(undefined8 *)(ray + 8);
      local_29e0._16_8_ = *(undefined8 *)(ray + 0x10);
      local_29e0._24_8_ = *(undefined8 *)(ray + 0x18);
      local_29e0._32_8_ = *(undefined8 *)(ray + 0x20);
      local_29e0._40_8_ = *(undefined8 *)(ray + 0x28);
      local_29e0._48_8_ = *(undefined8 *)(ray + 0x30);
      local_29e0._56_8_ = *(undefined8 *)(ray + 0x38);
      local_29e0._64_8_ = *(undefined8 *)(ray + 0x40);
      local_29e0._72_8_ = *(undefined8 *)(ray + 0x48);
      local_29e0._80_8_ = *(undefined8 *)(ray + 0x50);
      local_29e0._88_8_ = *(undefined8 *)(ray + 0x58);
      local_27e0._8_4_ = 0x7fffffff;
      local_27e0._0_8_ = 0x7fffffff7fffffff;
      local_27e0._12_4_ = 0x7fffffff;
      local_27e0._16_4_ = 0x7fffffff;
      local_27e0._20_4_ = 0x7fffffff;
      local_27e0._24_4_ = 0x7fffffff;
      local_27e0._28_4_ = 0x7fffffff;
      auVar79._8_4_ = 0x219392ef;
      auVar79._0_8_ = 0x219392ef219392ef;
      auVar79._12_4_ = 0x219392ef;
      auVar79._16_4_ = 0x219392ef;
      auVar79._20_4_ = 0x219392ef;
      auVar79._24_4_ = 0x219392ef;
      auVar79._28_4_ = 0x219392ef;
      auVar81 = ZEXT3264(auVar79);
      auVar71._8_4_ = 0x3f800000;
      auVar71._0_8_ = 0x3f8000003f800000;
      auVar71._12_4_ = 0x3f800000;
      auVar71._16_4_ = 0x3f800000;
      auVar71._20_4_ = 0x3f800000;
      auVar71._24_4_ = 0x3f800000;
      auVar71._28_4_ = 0x3f800000;
      auVar53 = vandps_avx(local_27e0,local_2980);
      auVar58 = vdivps_avx(auVar71,local_2980);
      auVar47 = vcmpps_avx(auVar53,auVar79,1);
      auVar61 = vdivps_avx(auVar71,local_2960);
      auVar53 = vandps_avx(local_27e0,local_2960);
      auVar62 = vdivps_avx(auVar71,_local_2940);
      auVar60 = vcmpps_avx(auVar53,auVar79,1);
      auVar53 = vandps_avx(local_27e0,_local_2940);
      auVar74._8_4_ = 0x5d5e0b6b;
      auVar74._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar74._12_4_ = 0x5d5e0b6b;
      auVar74._16_4_ = 0x5d5e0b6b;
      auVar74._20_4_ = 0x5d5e0b6b;
      auVar74._24_4_ = 0x5d5e0b6b;
      auVar74._28_4_ = 0x5d5e0b6b;
      auVar77 = ZEXT3264(auVar74);
      _local_2920 = vblendvps_avx(auVar58,auVar74,auVar47);
      local_2900 = vblendvps_avx(auVar61,auVar74,auVar60);
      auVar53 = vcmpps_avx(auVar53,auVar79,1);
      local_28e0 = vblendvps_avx(auVar62,auVar74,auVar53);
      auVar66 = ZEXT864(0) << 0x20;
      auVar53 = vcmpps_avx(_local_2920,ZEXT832(0) << 0x20,1);
      auVar68._8_4_ = 0x10;
      auVar68._0_8_ = 0x1000000010;
      auVar68._12_4_ = 0x10;
      auVar68._16_4_ = 0x10;
      auVar68._20_4_ = 0x10;
      auVar68._24_4_ = 0x10;
      auVar68._28_4_ = 0x10;
      local_28c0 = vandps_avx(auVar53,auVar68);
      auVar61._8_4_ = 0x20;
      auVar61._0_8_ = 0x2000000020;
      auVar61._12_4_ = 0x20;
      auVar61._16_4_ = 0x20;
      auVar61._20_4_ = 0x20;
      auVar61._24_4_ = 0x20;
      auVar61._28_4_ = 0x20;
      auVar69._8_4_ = 0x30;
      auVar69._0_8_ = 0x3000000030;
      auVar69._12_4_ = 0x30;
      auVar69._16_4_ = 0x30;
      auVar69._20_4_ = 0x30;
      auVar69._24_4_ = 0x30;
      auVar69._28_4_ = 0x30;
      auVar53 = vcmpps_avx(local_2900,ZEXT832(0) << 0x20,5);
      local_28a0 = vblendvps_avx(auVar69,auVar61,auVar53);
      auVar58._8_4_ = 0x40;
      auVar58._0_8_ = 0x4000000040;
      auVar58._12_4_ = 0x40;
      auVar58._16_4_ = 0x40;
      auVar58._20_4_ = 0x40;
      auVar58._24_4_ = 0x40;
      auVar58._28_4_ = 0x40;
      auVar62._8_4_ = 0x50;
      auVar62._0_8_ = 0x5000000050;
      auVar62._12_4_ = 0x50;
      auVar62._16_4_ = 0x50;
      auVar62._20_4_ = 0x50;
      auVar62._24_4_ = 0x50;
      auVar62._28_4_ = 0x50;
      auVar47 = ZEXT832(0) << 0x20;
      auVar53 = vcmpps_avx(local_28e0,auVar47,5);
      local_2880 = vblendvps_avx(auVar62,auVar58,auVar53);
      auVar53 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar47);
      auVar57 = vmaxps_avx(auVar57,auVar47);
      local_2820 = vpmovsxwd_avx2(auVar5);
      local_1e80._8_4_ = 0x7f800000;
      local_1e80._0_8_ = 0x7f8000007f800000;
      local_1e80._12_4_ = 0x7f800000;
      local_1e80._16_4_ = 0x7f800000;
      local_1e80._20_4_ = 0x7f800000;
      local_1e80._24_4_ = 0x7f800000;
      local_1e80._28_4_ = 0x7f800000;
      auVar94 = ZEXT3264(local_1e80);
      local_2860 = vblendvps_avx(local_1e80,auVar53,local_2820);
      auVar53._8_4_ = 0xff800000;
      auVar53._0_8_ = 0xff800000ff800000;
      auVar53._12_4_ = 0xff800000;
      auVar53._16_4_ = 0xff800000;
      auVar53._20_4_ = 0xff800000;
      auVar53._24_4_ = 0xff800000;
      auVar53._28_4_ = 0xff800000;
      local_2840 = vblendvps_avx(auVar53,auVar57,local_2820);
      auVar67 = vpcmpeqd_avx(local_2840._0_16_,local_2840._0_16_);
      local_2a40 = vpmovsxwd_avx2(auVar5 ^ auVar67);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar28 = 5;
      }
      else {
        uVar28 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      uVar30 = 0;
      puVar31 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar33 = (undefined1 (*) [32])local_1e40;
      local_2608 = sVar2;
      local_1e60 = local_2860;
      _local_2800 = mm_lookupmask_ps._16_8_;
      _uStack_27f8 = mm_lookupmask_ps._24_8_;
      _uStack_27f0 = mm_lookupmask_ps._16_8_;
      _uStack_27e8 = mm_lookupmask_ps._24_8_;
      auVar84 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                   CONCAT424(0x3f7ffffa,
                                             CONCAT420(0x3f7ffffa,
                                                       CONCAT416(0x3f7ffffa,
                                                                 CONCAT412(0x3f7ffffa,
                                                                           CONCAT48(0x3f7ffffa,
                                                                                                                                                                        
                                                  0x3f7ffffa3f7ffffa)))))));
      auVar88 = ZEXT3264(CONCAT428(0x3f800003,
                                   CONCAT424(0x3f800003,
                                             CONCAT420(0x3f800003,
                                                       CONCAT416(0x3f800003,
                                                                 CONCAT412(0x3f800003,
                                                                           CONCAT48(0x3f800003,
                                                                                                                                                                        
                                                  0x3f8000033f800003)))))));
LAB_015cc704:
      do {
        do {
          root.ptr = puVar31[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_015ccd07;
          puVar31 = puVar31 + -1;
          pauVar33 = pauVar33 + -1;
          auVar57 = *pauVar33;
          auVar90 = ZEXT3264(auVar57);
          auVar53 = vcmpps_avx(auVar57,local_2840,1);
        } while ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar53 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar53 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar53 >> 0x7f,0) == '\0') &&
                   (auVar53 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar53 >> 0xbf,0) == '\0') &&
                 (auVar53 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 -1 < auVar53[0x1f]);
        uVar29 = vmovmskps_avx(auVar53);
        uVar30 = CONCAT44((int)(uVar30 >> 0x20),uVar29);
        if (uVar28 < (uint)POPCOUNT(uVar29)) {
LAB_015cc741:
          do {
            lVar32 = 0x1c;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_015ccd07;
              auVar57 = vcmpps_avx(local_2840,auVar90._0_32_,6);
              if ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar57 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar57 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar57 >> 0x7f,0) != '\0') ||
                    (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar57 >> 0xbf,0) != '\0') ||
                  (auVar57 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar57[0x1f] < '\0') {
                bVar1 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                pvVar4 = This->leafIntersector;
                local_2a00[0] = local_2800;
                local_2a00[1] = uStack_27fc;
                local_2a00[2] = uStack_27f8;
                local_2a00[3] = uStack_27f4;
                local_2a00[4] = uStack_27f0;
                local_2a00[5] = uStack_27ec;
                local_2a00[6] = uStack_27e8;
                local_2a00[7] = uStack_27e4;
                local_2a20 = local_2a40;
                uVar34 = vmovmskps_avx(local_2a40);
                uVar27 = (ulong)(uVar34 ^ 0xff);
                while (uVar27 != 0) {
                  lVar32 = 0;
                  for (uVar30 = uVar27; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000
                      ) {
                    lVar32 = lVar32 + 1;
                  }
                  uVar27 = uVar27 - 1 & uVar27;
                  auVar66 = ZEXT1664(auVar66._0_16_);
                  auVar77 = ZEXT1664(auVar77._0_16_);
                  auVar81 = ZEXT1664(auVar81._0_16_);
                  cVar24 = (**(code **)((long)pvVar4 + (ulong)bVar1 * 0x40 + 0x28))
                                     (&local_27c0,ray,lVar32,context,
                                      (byte *)(root.ptr & 0xfffffffffffffff0));
                  auVar88 = ZEXT3264(CONCAT428(0x3f800003,
                                               CONCAT424(0x3f800003,
                                                         CONCAT420(0x3f800003,
                                                                   CONCAT416(0x3f800003,
                                                                             CONCAT412(0x3f800003,
                                                                                       CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                  auVar84 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                               CONCAT424(0x3f7ffffa,
                                                         CONCAT420(0x3f7ffffa,
                                                                   CONCAT416(0x3f7ffffa,
                                                                             CONCAT412(0x3f7ffffa,
                                                                                       CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                  auVar94 = ZEXT3264(CONCAT428(0x7f800000,
                                               CONCAT424(0x7f800000,
                                                         CONCAT420(0x7f800000,
                                                                   CONCAT416(0x7f800000,
                                                                             CONCAT412(0x7f800000,
                                                                                       CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  uVar30 = extraout_RDX;
                  if (cVar24 != '\0') {
                    local_2a00[lVar32] = 0xffffffff;
                  }
                }
                auVar16._8_4_ = local_2a00[2];
                auVar16._12_4_ = local_2a00[3];
                auVar16._0_4_ = local_2a00[0];
                auVar16._4_4_ = local_2a00[1];
                auVar16._16_4_ = local_2a00[4];
                auVar16._20_4_ = local_2a00[5];
                auVar16._24_4_ = local_2a00[6];
                auVar16._28_4_ = local_2a00[7];
                local_2a40 = vorps_avx(local_2a20,auVar16);
                auVar57 = _DAT_01f7b020 & ~local_2a40;
                if ((((((((auVar57 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar57 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar57 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar57 >> 0x7f,0) == '\0') &&
                      (auVar57 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar57 >> 0xbf,0) == '\0') &&
                    (auVar57 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar57[0x1f]) goto LAB_015ccd07;
                auVar56._8_4_ = 0xff800000;
                auVar56._0_8_ = 0xff800000ff800000;
                auVar56._12_4_ = 0xff800000;
                auVar56._16_4_ = 0xff800000;
                auVar56._20_4_ = 0xff800000;
                auVar56._24_4_ = 0xff800000;
                auVar56._28_4_ = 0xff800000;
                local_2840 = vblendvps_avx(local_2840,auVar56,local_2a40);
              }
              goto LAB_015cc704;
            }
            uVar27 = root.ptr & 0xfffffffffffffff0;
            uVar30 = 8;
            auVar57 = auVar94._0_32_;
            for (; (auVar90 = ZEXT3264(auVar57), lVar32 != 0x20 &&
                   (uVar3 = *(ulong *)((uVar27 - 0xe0) + lVar32 * 8), uVar3 != 8));
                lVar32 = lVar32 + 1) {
              auVar90._28_36_ = auVar66._28_36_;
              if ((root.ptr & 7) == 0) {
                uVar29 = *(undefined4 *)((root.ptr - 0x50) + lVar32 * 4);
                auVar36._4_4_ = uVar29;
                auVar36._0_4_ = uVar29;
                auVar36._8_4_ = uVar29;
                auVar36._12_4_ = uVar29;
                auVar36._16_4_ = uVar29;
                auVar36._20_4_ = uVar29;
                auVar36._24_4_ = uVar29;
                auVar36._28_4_ = uVar29;
                auVar17._8_8_ = local_29e0._8_8_;
                auVar17._0_8_ = local_29e0._0_8_;
                auVar17._16_8_ = local_29e0._16_8_;
                auVar17._24_8_ = local_29e0._24_8_;
                auVar19._8_8_ = local_29e0._40_8_;
                auVar19._0_8_ = local_29e0._32_8_;
                auVar19._16_8_ = local_29e0._48_8_;
                auVar19._24_8_ = local_29e0._56_8_;
                auVar21._8_8_ = local_29e0._72_8_;
                auVar21._0_8_ = local_29e0._64_8_;
                auVar21._16_8_ = local_29e0._80_8_;
                auVar21._24_8_ = local_29e0._88_8_;
                auVar53 = vsubps_avx(auVar36,auVar17);
                auVar90._0_4_ = (float)local_2920._0_4_ * auVar53._0_4_;
                auVar90._4_4_ = (float)local_2920._4_4_ * auVar53._4_4_;
                auVar90._8_4_ = fStack_2918 * auVar53._8_4_;
                auVar90._12_4_ = fStack_2914 * auVar53._12_4_;
                auVar90._16_4_ = fStack_2910 * auVar53._16_4_;
                auVar90._20_4_ = fStack_290c * auVar53._20_4_;
                auVar90._24_4_ = fStack_2908 * auVar53._24_4_;
                auVar61 = auVar90._0_32_;
                uVar29 = *(undefined4 *)((root.ptr - 0x30) + lVar32 * 4);
                auVar37._4_4_ = uVar29;
                auVar37._0_4_ = uVar29;
                auVar37._8_4_ = uVar29;
                auVar37._12_4_ = uVar29;
                auVar37._16_4_ = uVar29;
                auVar37._20_4_ = uVar29;
                auVar37._24_4_ = uVar29;
                auVar37._28_4_ = uVar29;
                auVar53 = vsubps_avx(auVar37,auVar19);
                uVar29 = *(undefined4 *)((root.ptr - 0x10) + lVar32 * 4);
                auVar72._4_4_ = uVar29;
                auVar72._0_4_ = uVar29;
                auVar72._8_4_ = uVar29;
                auVar72._12_4_ = uVar29;
                auVar72._16_4_ = uVar29;
                auVar72._20_4_ = uVar29;
                auVar72._24_4_ = uVar29;
                auVar72._28_4_ = uVar29;
                auVar77._0_4_ = local_2900._0_4_ * auVar53._0_4_;
                auVar77._4_4_ = local_2900._4_4_ * auVar53._4_4_;
                auVar77._8_4_ = local_2900._8_4_ * auVar53._8_4_;
                auVar77._12_4_ = local_2900._12_4_ * auVar53._12_4_;
                auVar77._16_4_ = local_2900._16_4_ * auVar53._16_4_;
                auVar77._20_4_ = local_2900._20_4_ * auVar53._20_4_;
                auVar77._24_4_ = local_2900._24_4_ * auVar53._24_4_;
                auVar75 = auVar77._0_32_;
                auVar53 = vsubps_avx(auVar72,auVar21);
                auVar81._0_4_ = local_28e0._0_4_ * auVar53._0_4_;
                auVar81._4_4_ = local_28e0._4_4_ * auVar53._4_4_;
                auVar81._8_4_ = local_28e0._8_4_ * auVar53._8_4_;
                auVar81._12_4_ = local_28e0._12_4_ * auVar53._12_4_;
                auVar81._16_4_ = local_28e0._16_4_ * auVar53._16_4_;
                auVar81._20_4_ = local_28e0._20_4_ * auVar53._20_4_;
                auVar81._24_4_ = local_28e0._24_4_ * auVar53._24_4_;
                auVar60 = auVar81._0_32_;
                auVar81 = ZEXT3264(auVar60);
                uVar29 = *(undefined4 *)((root.ptr - 0x40) + lVar32 * 4);
                auVar38._4_4_ = uVar29;
                auVar38._0_4_ = uVar29;
                auVar38._8_4_ = uVar29;
                auVar38._12_4_ = uVar29;
                auVar38._16_4_ = uVar29;
                auVar38._20_4_ = uVar29;
                auVar38._24_4_ = uVar29;
                auVar38._28_4_ = uVar29;
                auVar53 = vsubps_avx(auVar38,auVar17);
                auVar6._4_4_ = (float)local_2920._4_4_ * auVar53._4_4_;
                auVar6._0_4_ = (float)local_2920._0_4_ * auVar53._0_4_;
                auVar6._8_4_ = fStack_2918 * auVar53._8_4_;
                auVar6._12_4_ = fStack_2914 * auVar53._12_4_;
                auVar6._16_4_ = fStack_2910 * auVar53._16_4_;
                auVar6._20_4_ = fStack_290c * auVar53._20_4_;
                auVar6._24_4_ = fStack_2908 * auVar53._24_4_;
                auVar6._28_4_ = (int)((ulong)local_29e0._24_8_ >> 0x20);
                uVar29 = *(undefined4 *)((root.ptr - 0x20) + lVar32 * 4);
                auVar39._4_4_ = uVar29;
                auVar39._0_4_ = uVar29;
                auVar39._8_4_ = uVar29;
                auVar39._12_4_ = uVar29;
                auVar39._16_4_ = uVar29;
                auVar39._20_4_ = uVar29;
                auVar39._24_4_ = uVar29;
                auVar39._28_4_ = uVar29;
                auVar53 = vsubps_avx(auVar39,auVar19);
                auVar7._4_4_ = local_2900._4_4_ * auVar53._4_4_;
                auVar7._0_4_ = local_2900._0_4_ * auVar53._0_4_;
                auVar7._8_4_ = local_2900._8_4_ * auVar53._8_4_;
                auVar7._12_4_ = local_2900._12_4_ * auVar53._12_4_;
                auVar7._16_4_ = local_2900._16_4_ * auVar53._16_4_;
                auVar7._20_4_ = local_2900._20_4_ * auVar53._20_4_;
                auVar7._24_4_ = local_2900._24_4_ * auVar53._24_4_;
                auVar7._28_4_ = (int)((ulong)local_29e0._56_8_ >> 0x20);
                uVar29 = *(undefined4 *)(root.ptr + lVar32 * 4);
                auVar40._4_4_ = uVar29;
                auVar40._0_4_ = uVar29;
                auVar40._8_4_ = uVar29;
                auVar40._12_4_ = uVar29;
                auVar40._16_4_ = uVar29;
                auVar40._20_4_ = uVar29;
                auVar40._24_4_ = uVar29;
                auVar40._28_4_ = uVar29;
                auVar53 = vsubps_avx(auVar40,auVar21);
                auVar8._4_4_ = local_28e0._4_4_ * auVar53._4_4_;
                auVar8._0_4_ = local_28e0._0_4_ * auVar53._0_4_;
                auVar8._8_4_ = local_28e0._8_4_ * auVar53._8_4_;
                auVar8._12_4_ = local_28e0._12_4_ * auVar53._12_4_;
                auVar8._16_4_ = local_28e0._16_4_ * auVar53._16_4_;
                auVar8._20_4_ = local_28e0._20_4_ * auVar53._20_4_;
                auVar8._24_4_ = local_28e0._24_4_ * auVar53._24_4_;
                auVar8._28_4_ = (int)((ulong)local_29e0._88_8_ >> 0x20);
                auVar53 = vminps_avx(auVar61,auVar6);
                auVar47 = vminps_avx(auVar75,auVar7);
                auVar53 = vmaxps_avx(auVar53,auVar47);
                auVar47 = vminps_avx(auVar60,auVar8);
                auVar53 = vmaxps_avx(auVar53,auVar47);
                auVar41._4_4_ = auVar84._4_4_ * auVar53._4_4_;
                auVar41._0_4_ = auVar84._0_4_ * auVar53._0_4_;
                auVar41._8_4_ = auVar84._8_4_ * auVar53._8_4_;
                auVar41._12_4_ = auVar84._12_4_ * auVar53._12_4_;
                auVar41._16_4_ = auVar84._16_4_ * auVar53._16_4_;
                auVar41._20_4_ = auVar84._20_4_ * auVar53._20_4_;
                auVar41._24_4_ = auVar84._24_4_ * auVar53._24_4_;
                auVar41._28_4_ = auVar53._28_4_;
                auVar53 = vmaxps_avx(auVar61,auVar6);
                auVar47 = vmaxps_avx(auVar75,auVar7);
                auVar47 = vminps_avx(auVar53,auVar47);
                auVar53 = vmaxps_avx(auVar60,auVar8);
                auVar53 = vminps_avx(auVar47,auVar53);
                auVar9._4_4_ = auVar88._4_4_ * auVar53._4_4_;
                auVar9._0_4_ = auVar88._0_4_ * auVar53._0_4_;
                auVar9._8_4_ = auVar88._8_4_ * auVar53._8_4_;
                auVar9._12_4_ = auVar88._12_4_ * auVar53._12_4_;
                auVar9._16_4_ = auVar88._16_4_ * auVar53._16_4_;
                auVar9._20_4_ = auVar88._20_4_ * auVar53._20_4_;
                auVar9._24_4_ = auVar88._24_4_ * auVar53._24_4_;
                auVar9._28_4_ = auVar53._28_4_;
                auVar53 = vmaxps_avx(auVar41,local_2860);
                auVar47 = vminps_avx(auVar9,local_2840);
              }
              else {
                uVar29 = *(undefined4 *)((uVar27 - 0x50) + lVar32 * 4);
                auVar63._4_4_ = uVar29;
                auVar63._0_4_ = uVar29;
                auVar63._8_4_ = uVar29;
                auVar63._12_4_ = uVar29;
                auVar63._16_4_ = uVar29;
                auVar63._20_4_ = uVar29;
                auVar63._24_4_ = uVar29;
                auVar63._28_4_ = uVar29;
                uVar29 = *(undefined4 *)((uVar27 - 0x40) + lVar32 * 4);
                auVar48._4_4_ = uVar29;
                auVar48._0_4_ = uVar29;
                auVar48._8_4_ = uVar29;
                auVar48._12_4_ = uVar29;
                auVar48._16_4_ = uVar29;
                auVar48._20_4_ = uVar29;
                auVar48._24_4_ = uVar29;
                auVar48._28_4_ = uVar29;
                uVar29 = *(undefined4 *)((uVar27 - 0x30) + lVar32 * 4);
                auVar42._4_4_ = uVar29;
                auVar42._0_4_ = uVar29;
                auVar42._8_4_ = uVar29;
                auVar42._12_4_ = uVar29;
                auVar42._16_4_ = uVar29;
                auVar42._20_4_ = uVar29;
                auVar42._24_4_ = uVar29;
                auVar42._28_4_ = uVar29;
                uVar29 = *(undefined4 *)((uVar27 - 0x20) + lVar32 * 4);
                auVar76._4_4_ = uVar29;
                auVar76._0_4_ = uVar29;
                auVar76._8_4_ = uVar29;
                auVar76._12_4_ = uVar29;
                auVar76._16_4_ = uVar29;
                auVar76._20_4_ = uVar29;
                auVar76._24_4_ = uVar29;
                auVar76._28_4_ = uVar29;
                uVar29 = *(undefined4 *)((uVar27 - 0x10) + lVar32 * 4);
                auVar73._4_4_ = uVar29;
                auVar73._0_4_ = uVar29;
                auVar73._8_4_ = uVar29;
                auVar73._12_4_ = uVar29;
                auVar73._16_4_ = uVar29;
                auVar73._20_4_ = uVar29;
                auVar73._24_4_ = uVar29;
                auVar73._28_4_ = uVar29;
                uVar29 = *(undefined4 *)(uVar27 + lVar32 * 4);
                auVar70._4_4_ = uVar29;
                auVar70._0_4_ = uVar29;
                auVar70._8_4_ = uVar29;
                auVar70._12_4_ = uVar29;
                auVar70._16_4_ = uVar29;
                auVar70._20_4_ = uVar29;
                auVar70._24_4_ = uVar29;
                auVar70._28_4_ = uVar29;
                fVar35 = *(float *)(uVar27 + 0x10 + lVar32 * 4);
                auVar80._4_4_ = fVar35;
                auVar80._0_4_ = fVar35;
                auVar80._8_4_ = fVar35;
                auVar80._12_4_ = fVar35;
                auVar80._16_4_ = fVar35;
                auVar80._20_4_ = fVar35;
                auVar80._24_4_ = fVar35;
                auVar80._28_4_ = fVar35;
                fVar43 = *(float *)(uVar27 + 0x20 + lVar32 * 4);
                auVar83._4_4_ = fVar43;
                auVar83._0_4_ = fVar43;
                auVar83._8_4_ = fVar43;
                auVar83._12_4_ = fVar43;
                auVar83._16_4_ = fVar43;
                auVar83._20_4_ = fVar43;
                auVar83._24_4_ = fVar43;
                auVar83._28_4_ = fVar43;
                fVar44 = *(float *)(uVar27 + 0x30 + lVar32 * 4);
                auVar87._4_4_ = fVar44;
                auVar87._0_4_ = fVar44;
                auVar87._8_4_ = fVar44;
                auVar87._12_4_ = fVar44;
                auVar87._16_4_ = fVar44;
                auVar87._20_4_ = fVar44;
                auVar87._24_4_ = fVar44;
                auVar87._28_4_ = fVar44;
                uVar29 = *(undefined4 *)(uVar27 + 0x40 + lVar32 * 4);
                auVar65._4_4_ = uVar29;
                auVar65._0_4_ = uVar29;
                auVar65._8_4_ = uVar29;
                auVar65._12_4_ = uVar29;
                auVar65._16_4_ = uVar29;
                auVar65._20_4_ = uVar29;
                auVar65._24_4_ = uVar29;
                auVar65._28_4_ = uVar29;
                uVar29 = *(undefined4 *)(uVar27 + 0x50 + lVar32 * 4);
                auVar54._4_4_ = uVar29;
                auVar54._0_4_ = uVar29;
                auVar54._8_4_ = uVar29;
                auVar54._12_4_ = uVar29;
                auVar54._16_4_ = uVar29;
                auVar54._20_4_ = uVar29;
                auVar54._24_4_ = uVar29;
                auVar54._28_4_ = uVar29;
                uVar29 = *(undefined4 *)(uVar27 + 0x60 + lVar32 * 4);
                auVar59._4_4_ = uVar29;
                auVar59._0_4_ = uVar29;
                auVar59._8_4_ = uVar29;
                auVar59._12_4_ = uVar29;
                auVar59._16_4_ = uVar29;
                auVar59._20_4_ = uVar29;
                auVar59._24_4_ = uVar29;
                auVar59._28_4_ = uVar29;
                auVar22._8_8_ = local_29e0._72_8_;
                auVar22._0_8_ = local_29e0._64_8_;
                auVar22._16_8_ = local_29e0._80_8_;
                auVar22._24_8_ = local_29e0._88_8_;
                auVar5 = vfmadd231ps_fma(auVar65,auVar22,auVar80);
                auVar67 = vfmadd231ps_fma(auVar54,auVar22,auVar83);
                auVar64 = vfmadd231ps_fma(auVar59,auVar22,auVar87);
                auVar10._4_4_ = fVar35 * (float)local_2940._4_4_;
                auVar10._0_4_ = fVar35 * (float)local_2940._0_4_;
                auVar10._8_4_ = fVar35 * fStack_2938;
                auVar10._12_4_ = fVar35 * fStack_2934;
                auVar10._16_4_ = fVar35 * fStack_2930;
                auVar10._20_4_ = fVar35 * fStack_292c;
                auVar10._24_4_ = fVar35 * fStack_2928;
                auVar10._28_4_ = fVar35;
                auVar11._4_4_ = fVar43 * (float)local_2940._4_4_;
                auVar11._0_4_ = fVar43 * (float)local_2940._0_4_;
                auVar11._8_4_ = fVar43 * fStack_2938;
                auVar11._12_4_ = fVar43 * fStack_2934;
                auVar11._16_4_ = fVar43 * fStack_2930;
                auVar11._20_4_ = fVar43 * fStack_292c;
                auVar11._24_4_ = fVar43 * fStack_2928;
                auVar11._28_4_ = fVar43;
                auVar12._4_4_ = fVar44 * (float)local_2940._4_4_;
                auVar12._0_4_ = fVar44 * (float)local_2940._0_4_;
                auVar12._8_4_ = fVar44 * fStack_2938;
                auVar12._12_4_ = fVar44 * fStack_2934;
                auVar12._16_4_ = fVar44 * fStack_2930;
                auVar12._20_4_ = fVar44 * fStack_292c;
                auVar12._24_4_ = fVar44 * fStack_2928;
                auVar12._28_4_ = fVar44;
                auVar78 = vfmadd231ps_fma(auVar10,local_2960,auVar76);
                auVar89 = vfmadd231ps_fma(auVar11,local_2960,auVar73);
                auVar85 = vfmadd231ps_fma(auVar12,auVar70,local_2960);
                auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),local_2980,auVar63);
                auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),local_2980,auVar48);
                auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar42,local_2980);
                auVar53 = vandps_avx(ZEXT1632(auVar78),local_27e0);
                auVar93._8_4_ = 0x219392ef;
                auVar93._0_8_ = 0x219392ef219392ef;
                auVar93._12_4_ = 0x219392ef;
                auVar93._16_4_ = 0x219392ef;
                auVar93._20_4_ = 0x219392ef;
                auVar93._24_4_ = 0x219392ef;
                auVar93._28_4_ = 0x219392ef;
                auVar53 = vcmpps_avx(auVar53,auVar93,1);
                auVar47 = vblendvps_avx(ZEXT1632(auVar78),auVar93,auVar53);
                auVar53 = vandps_avx(ZEXT1632(auVar89),local_27e0);
                auVar53 = vcmpps_avx(auVar53,auVar93,1);
                auVar60 = vblendvps_avx(ZEXT1632(auVar89),auVar93,auVar53);
                auVar53 = vandps_avx(ZEXT1632(auVar85),local_27e0);
                auVar53 = vcmpps_avx(auVar53,auVar93,1);
                auVar53 = vblendvps_avx(ZEXT1632(auVar85),auVar93,auVar53);
                auVar20._8_8_ = local_29e0._40_8_;
                auVar20._0_8_ = local_29e0._32_8_;
                auVar20._16_8_ = local_29e0._48_8_;
                auVar20._24_8_ = local_29e0._56_8_;
                auVar78 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar20,auVar76);
                auVar89 = vfmadd231ps_fma(ZEXT1632(auVar67),auVar20,auVar73);
                auVar58 = vrcpps_avx(auVar47);
                auVar85 = vfmadd231ps_fma(ZEXT1632(auVar64),auVar20,auVar70);
                auVar61 = vrcpps_avx(auVar60);
                auVar75._8_4_ = 0x3f800000;
                auVar75._0_8_ = 0x3f8000003f800000;
                auVar75._12_4_ = 0x3f800000;
                auVar75._16_4_ = 0x3f800000;
                auVar75._20_4_ = 0x3f800000;
                auVar75._24_4_ = 0x3f800000;
                auVar75._28_4_ = 0x3f800000;
                auVar5 = vfnmadd213ps_fma(auVar47,auVar58,auVar75);
                auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar58,auVar58);
                auVar81 = ZEXT1664(auVar5);
                auVar67 = vfnmadd213ps_fma(auVar60,auVar61,auVar75);
                auVar67 = vfmadd132ps_fma(ZEXT1632(auVar67),auVar61,auVar61);
                auVar47 = vrcpps_avx(auVar53);
                auVar64 = vfnmadd213ps_fma(auVar53,auVar47,auVar75);
                auVar64 = vfmadd132ps_fma(ZEXT1632(auVar64),auVar47,auVar47);
                auVar18._8_8_ = local_29e0._8_8_;
                auVar18._0_8_ = local_29e0._0_8_;
                auVar18._16_8_ = local_29e0._16_8_;
                auVar18._24_8_ = local_29e0._24_8_;
                auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar18,auVar63);
                auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar18,auVar48);
                auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar18,auVar42);
                fVar46 = auVar78._0_4_ * -auVar5._0_4_;
                fVar50 = auVar78._4_4_ * -auVar5._4_4_;
                auVar13._4_4_ = fVar50;
                auVar13._0_4_ = fVar46;
                fVar51 = auVar78._8_4_ * -auVar5._8_4_;
                auVar13._8_4_ = fVar51;
                fVar52 = auVar78._12_4_ * -auVar5._12_4_;
                auVar13._12_4_ = fVar52;
                auVar13._16_4_ = 0x80000000;
                auVar13._20_4_ = 0x80000000;
                auVar13._24_4_ = 0x80000000;
                auVar13._28_4_ = 0x80000000;
                auVar55._0_4_ = auVar89._0_4_ * -auVar67._0_4_;
                auVar55._4_4_ = auVar89._4_4_ * -auVar67._4_4_;
                auVar55._8_4_ = auVar89._8_4_ * -auVar67._8_4_;
                auVar55._12_4_ = auVar89._12_4_ * -auVar67._12_4_;
                auVar55._16_4_ = 0x80000000;
                auVar55._20_4_ = 0x80000000;
                auVar55._24_4_ = 0x80000000;
                auVar55._28_4_ = 0;
                fVar35 = auVar85._0_4_ * -auVar64._0_4_;
                fVar43 = auVar85._4_4_ * -auVar64._4_4_;
                auVar14._4_4_ = fVar43;
                auVar14._0_4_ = fVar35;
                fVar44 = auVar85._8_4_ * -auVar64._8_4_;
                auVar14._8_4_ = fVar44;
                fVar45 = auVar85._12_4_ * -auVar64._12_4_;
                auVar14._12_4_ = fVar45;
                auVar14._16_4_ = 0x80000000;
                auVar14._20_4_ = 0x80000000;
                auVar14._24_4_ = 0x80000000;
                auVar14._28_4_ = 0x80000000;
                auVar60 = ZEXT1632(CONCAT412(auVar5._12_4_ + fVar52,
                                             CONCAT48(auVar5._8_4_ + fVar51,
                                                      CONCAT44(auVar5._4_4_ + fVar50,
                                                               auVar5._0_4_ + fVar46))));
                auVar58 = ZEXT1632(CONCAT412(auVar67._12_4_ + auVar55._12_4_,
                                             CONCAT48(auVar67._8_4_ + auVar55._8_4_,
                                                      CONCAT44(auVar67._4_4_ + auVar55._4_4_,
                                                               auVar67._0_4_ + auVar55._0_4_))));
                auVar84 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                             CONCAT424(0x3f7ffffa,
                                                       CONCAT420(0x3f7ffffa,
                                                                 CONCAT416(0x3f7ffffa,
                                                                           CONCAT412(0x3f7ffffa,
                                                                                     CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                auVar61 = ZEXT1632(CONCAT412(auVar64._12_4_ + fVar45,
                                             CONCAT48(auVar64._8_4_ + fVar44,
                                                      CONCAT44(auVar64._4_4_ + fVar43,
                                                               auVar64._0_4_ + fVar35))));
                auVar88 = ZEXT3264(CONCAT428(0x3f800003,
                                             CONCAT424(0x3f800003,
                                                       CONCAT420(0x3f800003,
                                                                 CONCAT416(0x3f800003,
                                                                           CONCAT412(0x3f800003,
                                                                                     CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                auVar53 = vpminsd_avx2(auVar13,auVar60);
                auVar47 = vpminsd_avx2(auVar55,auVar58);
                auVar53 = vpmaxsd_avx2(auVar53,auVar47);
                auVar47 = vpminsd_avx2(auVar14,auVar61);
                auVar53 = vpmaxsd_avx2(auVar53,auVar47);
                auVar47 = vpmaxsd_avx2(auVar13,auVar60);
                auVar60 = vpmaxsd_avx2(auVar55,auVar58);
                auVar60 = vpminsd_avx2(auVar47,auVar60);
                auVar47 = vpmaxsd_avx2(auVar14,auVar61);
                auVar60 = vpminsd_avx2(auVar60,auVar47);
                auVar41._4_4_ = auVar53._4_4_ * 0.99999964;
                auVar41._0_4_ = auVar53._0_4_ * 0.99999964;
                auVar41._8_4_ = auVar53._8_4_ * 0.99999964;
                auVar41._12_4_ = auVar53._12_4_ * 0.99999964;
                auVar41._16_4_ = auVar53._16_4_ * 0.99999964;
                auVar41._20_4_ = auVar53._20_4_ * 0.99999964;
                auVar41._24_4_ = auVar53._24_4_ * 0.99999964;
                auVar41._28_4_ = auVar47._28_4_;
                auVar15._4_4_ = auVar60._4_4_ * 1.0000004;
                auVar15._0_4_ = auVar60._0_4_ * 1.0000004;
                auVar15._8_4_ = auVar60._8_4_ * 1.0000004;
                auVar15._12_4_ = auVar60._12_4_ * 1.0000004;
                auVar15._16_4_ = auVar60._16_4_ * 1.0000004;
                auVar15._20_4_ = auVar60._20_4_ * 1.0000004;
                auVar15._24_4_ = auVar60._24_4_ * 1.0000004;
                auVar15._28_4_ = auVar60._28_4_;
                auVar53 = vpmaxsd_avx2(auVar41,local_2860);
                auVar47 = vpminsd_avx2(auVar15,local_2840);
              }
              auVar77 = ZEXT3264(auVar75);
              auVar66 = ZEXT3264(auVar61);
              auVar53 = vcmpps_avx(auVar53,auVar47,2);
              auVar5 = vpackssdw_avx(auVar53._0_16_,auVar53._16_16_);
              auVar53 = vpmovzxwd_avx2(auVar5);
              auVar47 = vpslld_avx2(auVar53,0x1f);
              uVar23 = uVar30;
              auVar53 = auVar57;
              if (((((((((auVar47 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar47 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar47 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar47 >> 0x7f,0) != '\0') ||
                     (auVar47 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar47 >> 0xbf,0) != '\0') ||
                   (auVar47 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar47[0x1f] < '\0') &&
                 (auVar53 = vblendvps_avx(auVar94._0_32_,auVar41,auVar47), uVar23 = uVar3,
                 uVar30 != 8)) {
                *puVar31 = uVar30;
                puVar31 = puVar31 + 1;
                *pauVar33 = auVar57;
                pauVar33 = pauVar33 + 1;
              }
              auVar57 = auVar53;
              uVar30 = uVar23;
            }
            if (uVar30 == 8) goto LAB_015ccae4;
            auVar53 = vcmpps_avx(local_2840,auVar57,6);
            uVar29 = vmovmskps_avx(auVar53);
            root.ptr = uVar30;
          } while ((byte)uVar28 < (byte)POPCOUNT(uVar29));
          *puVar31 = uVar30;
          puVar31 = puVar31 + 1;
          *pauVar33 = auVar57;
          pauVar33 = pauVar33 + 1;
LAB_015ccae4:
          iVar26 = 4;
        }
        else {
          while (uVar30 != 0) {
            sVar2 = 0;
            for (uVar27 = uVar30; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
              sVar2 = sVar2 + 1;
            }
            uVar30 = uVar30 - 1 & uVar30;
            local_2a20._0_8_ = sVar2;
            auVar66 = ZEXT1664(auVar66._0_16_);
            auVar77 = ZEXT1664(auVar77._0_16_);
            auVar81 = ZEXT1664(auVar81._0_16_);
            bVar25 = occluded1(This,bvh,root,sVar2,(Precalculations *)&local_27c0,ray,
                               (TravRayK<8,_true> *)&local_29e0.field_0,context);
            if (bVar25) {
              *(undefined4 *)(local_2a40 + local_2a20._0_8_ * 4) = 0xffffffff;
            }
          }
          auVar53 = _DAT_01f7b020 & ~local_2a40;
          iVar26 = 3;
          auVar94 = ZEXT3264(CONCAT428(0x7f800000,
                                       CONCAT424(0x7f800000,
                                                 CONCAT420(0x7f800000,
                                                           CONCAT416(0x7f800000,
                                                                     CONCAT412(0x7f800000,
                                                                               CONCAT48(0x7f800000,
                                                                                                                                                                                
                                                  0x7f8000007f800000)))))));
          auVar84 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                       CONCAT424(0x3f7ffffa,
                                                 CONCAT420(0x3f7ffffa,
                                                           CONCAT416(0x3f7ffffa,
                                                                     CONCAT412(0x3f7ffffa,
                                                                               CONCAT48(0x3f7ffffa,
                                                                                                                                                                                
                                                  0x3f7ffffa3f7ffffa)))))));
          auVar88 = ZEXT3264(CONCAT428(0x3f800003,
                                       CONCAT424(0x3f800003,
                                                 CONCAT420(0x3f800003,
                                                           CONCAT416(0x3f800003,
                                                                     CONCAT412(0x3f800003,
                                                                               CONCAT48(0x3f800003,
                                                                                                                                                                                
                                                  0x3f8000033f800003)))))));
          auVar90 = ZEXT3264(auVar57);
          if ((((((((auVar53 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar53 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar53 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar53 >> 0x7f,0) != '\0') ||
                (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar53 >> 0xbf,0) != '\0') ||
              (auVar53 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar53[0x1f] < '\0') {
            auVar57._8_4_ = 0xff800000;
            auVar57._0_8_ = 0xff800000ff800000;
            auVar57._12_4_ = 0xff800000;
            auVar57._16_4_ = 0xff800000;
            auVar57._20_4_ = 0xff800000;
            auVar57._24_4_ = 0xff800000;
            auVar57._28_4_ = 0xff800000;
            local_2840 = vblendvps_avx(local_2840,auVar57,local_2a40);
            iVar26 = 2;
          }
          uVar30 = 0;
          if (uVar28 < (uint)POPCOUNT(uVar29)) goto LAB_015cc741;
          uVar30 = 0;
        }
      } while (iVar26 != 3);
LAB_015ccd07:
      auVar57 = vandps_avx(local_2820,local_2a40);
      auVar49._8_4_ = 0xff800000;
      auVar49._0_8_ = 0xff800000ff800000;
      auVar49._12_4_ = 0xff800000;
      auVar49._16_4_ = 0xff800000;
      auVar49._20_4_ = 0xff800000;
      auVar49._24_4_ = 0xff800000;
      auVar49._28_4_ = 0xff800000;
      auVar57 = vmaskmovps_avx(auVar57,auVar49);
      *(undefined1 (*) [32])(ray + 0x100) = auVar57;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }